

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O0

void __thiscall
ConfidentialTxOut_DecodeRangeProofInfoErrorTest_Test::TestBody
          (ConfidentialTxOut_DecodeRangeProofInfoErrorTest_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  CfdException *cfd_exception_1;
  Message local_170 [2];
  CfdException *anon_var_0_1;
  byte local_141;
  char *pcStack_140;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  string local_130;
  undefined1 local_110 [8];
  ByteData range_proof_1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  CfdException *cfd_exception;
  Message local_a0 [2];
  CfdException *anon_var_0;
  RangeProofInfo local_88;
  byte local_69;
  char *pcStack_68;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData range_proof;
  ConfidentialTxOut_DecodeRangeProofInfoErrorTest_Test *this_local;
  
  range_proof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"",&local_49);
  cfd::core::ByteData::ByteData((ByteData *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff98,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff98);
  if (bVar1) {
    local_69 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTxOut::DecodeRangeProofInfo(&local_88,(ByteData *)local_28);
    }
    if ((local_69 & 1) == 0) {
      pcStack_68 = 
      "Expected: ConfidentialTxOut::DecodeRangeProofInfo(range_proof) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_004de339;
    }
  }
  else {
LAB_004de339:
    testing::Message::Message(local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cfd_exception,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x10e,pcStack_68);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cfd_exception,local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cfd_exception);
    testing::Message::~Message(local_a0);
  }
  cfd::core::ByteData::~ByteData((ByteData *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_130,"0000",(allocator *)((long)&gtest_msg_1.value + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_110,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffec0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffec0);
  if (bVar1) {
    local_141 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTxOut::DecodeRangeProofInfo
                ((RangeProofInfo *)&anon_var_0_1,(ByteData *)local_110);
    }
    if ((local_141 & 1) != 0) goto LAB_004de97d;
    pcStack_140 = 
    "Expected: ConfidentialTxOut::DecodeRangeProofInfo(range_proof) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_170);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&cfd_exception_1,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
             ,0x119,pcStack_140);
  testing::internal::AssertHelper::operator=((AssertHelper *)&cfd_exception_1,local_170);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cfd_exception_1);
  testing::Message::~Message(local_170);
LAB_004de97d:
  cfd::core::ByteData::~ByteData((ByteData *)local_110);
  return;
}

Assistant:

TEST(ConfidentialTxOut, DecodeRangeProofInfoErrorTest) {  
  // empty range_proof
  {
    ByteData range_proof("");
    try {
      EXPECT_THROW(ConfidentialTxOut::DecodeRangeProofInfo(range_proof), CfdException);
    } catch (const CfdException &cfd_exception) {
      EXPECT_EQ(cfd_exception.GetErrorCode(), CfdError::kCfdIllegalArgumentError);
      EXPECT_STREQ(cfd_exception.what(), "Secp256k1 empty range proof Error.");
    }
  }
  
  // invalid range_proof
  {
    ByteData range_proof("0000");
    try {
      EXPECT_THROW(ConfidentialTxOut::DecodeRangeProofInfo(range_proof), CfdException);
    } catch (const CfdException &cfd_exception) {
      EXPECT_EQ(cfd_exception.GetErrorCode(), CfdError::kCfdIllegalArgumentError);
      EXPECT_STREQ(cfd_exception.what(), "Secp256k1 empty range proof Error.");
    }
  }
}